

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O0

Token * __thiscall EOPlus::Lexer::ReadToken(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  Lexer_Error *this_00;
  variant local_330;
  Token local_2f0;
  undefined1 local_29a;
  allocator<char> local_299;
  string local_298;
  Token local_278;
  Token local_228;
  char local_1d1;
  undefined1 local_1d0 [7];
  char cc;
  Token local_180;
  Token local_130;
  undefined4 local_dc;
  function<bool_(char)> local_d8;
  char local_b5 [8];
  char c;
  variant local_a8;
  undefined1 local_68 [8];
  Token token;
  Lexer *this_local;
  
  token._72_8_ = this;
  util::variant::variant(&local_a8);
  Token::Token((Token *)local_68,Invalid,&local_a8);
  util::variant::~variant(&local_a8);
  local_b5[0] = '\0';
  do {
    std::function<bool(char)>::function<bool(&)(char),void>
              ((function<bool(char)> *)&local_d8,ctype_whitespace);
    bVar1 = GetCharIf(this,local_b5,&local_d8);
    std::function<bool_(char)>::~function(&local_d8);
  } while (bVar1);
  bVar1 = std::queue<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::
          empty(&this->token_buffer);
  if (bVar1) {
    bVar1 = PeekChar(this,local_b5);
    if (bVar1) {
      bVar1 = ctype_digit(local_b5[0]);
      if (bVar1) {
        ReadNumber(&local_130,this);
        Token::operator=((Token *)local_68,&local_130);
        Token::~Token(&local_130);
      }
      else {
        bVar1 = ctype_ident_start(local_b5[0]);
        if (bVar1) {
          ReadIdentifier(&local_180,this);
          Token::operator=((Token *)local_68,&local_180);
          Token::~Token(&local_180);
        }
        else {
          bVar1 = ctype_symbol(local_b5[0]);
          if (bVar1) {
            ReadSymbol((Token *)local_1d0,this);
            Token::operator=((Token *)local_68,(Token *)local_1d0);
            Token::~Token((Token *)local_1d0);
          }
          else {
            bVar1 = ctype_op(local_b5[0]);
            if (bVar1) {
              local_1d1 = '\0';
              ReadOperator(&local_228,this);
              Token::operator=((Token *)local_68,&local_228);
              Token::~Token(&local_228);
              iVar2 = util::variant::operator_cast_to_int((variant *)&token);
              if (((iVar2 == 0xf) && (bVar1 = PeekChar(this,&local_1d1), bVar1)) &&
                 (local_1d1 == '/')) {
                while (local_b5[0] != '\n') {
                  GetChar(this,local_b5);
                }
                ReadToken(__return_storage_ptr__,this);
                goto LAB_001767ba;
              }
            }
            else if (local_b5[0] == '\"') {
              ReadString(&local_278,this);
              Token::operator=((Token *)local_68,&local_278);
              Token::~Token(&local_278);
            }
          }
        }
      }
      if (local_68._0_4_ == Invalid) {
        local_29a = 1;
        this_00 = (Lexer_Error *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_298,"Unknown token",&local_299);
        Lexer_Error::Lexer_Error(this_00,&local_298,this->row,this->col);
        local_29a = 0;
        __cxa_throw(this_00,&Lexer_Error::typeinfo,Lexer_Error::~Lexer_Error);
      }
      Token::Token(__return_storage_ptr__,(Token *)local_68);
    }
    else {
      util::variant::variant(&local_330);
      Token::Token(&local_2f0,EndOfFile,&local_330);
      Token::operator=((Token *)local_68,&local_2f0);
      Token::~Token(&local_2f0);
      util::variant::~variant(&local_330);
      Token::Token(__return_storage_ptr__,(Token *)local_68);
    }
  }
  else {
    pvVar3 = std::queue<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::
             front(&this->token_buffer);
    Token::operator=((Token *)local_68,pvVar3);
    std::queue<EOPlus::Token,_std::deque<EOPlus::Token,_std::allocator<EOPlus::Token>_>_>::pop
              (&this->token_buffer);
    Token::Token(__return_storage_ptr__,(Token *)local_68);
  }
LAB_001767ba:
  local_dc = 1;
  Token::~Token((Token *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadToken()
	{
		Token token;

		char c = '\0';

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_digit(c))
			{
				token = this->ReadNumber();
			}
			else if (ctype_ident_start(c))
			{
				token = this->ReadIdentifier();
			}
			else if (ctype_symbol(c))
			{
				token = this->ReadSymbol();
			}
			else if (ctype_op(c)) // Assumes '/' is a valid operator
			{
				char cc = '\0';
				token = this->ReadOperator();

				if (int(token.data) == UOP2('/', '\0') && this->PeekChar(cc) && cc == '/') // Line-comments
				{
					while (c != '\n')
						this->GetChar(c);

					return this->ReadToken();
				}
			}
			else if (c == '"')
			{
				token = this->ReadString();
			}

			if (token.type == Token::Invalid)
				throw Lexer_Error("Unknown token", this->row, this->col);

			return token;
		}

		token = Token(Token::EndOfFile);

		return token;
	}